

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

ScalarFunction * duckdb::CosFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe9c;
  FunctionNullHandling in_stack_fffffffffffffea8;
  bind_lambda_function_t in_stack_fffffffffffffeb0;
  scalar_function_t local_148;
  LogicalType local_128;
  LogicalType local_110;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_f8;
  LogicalType local_e0;
  BaseScalarFunction local_c8;
  
  LogicalType::LogicalType(&local_110,DOUBLE);
  __l._M_len = 1;
  __l._M_array = &local_110;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_f8,__l,(allocator_type *)&stack0xfffffffffffffeb7);
  LogicalType::LogicalType(&local_128,DOUBLE);
  local_148.super__Function_base._M_functor._8_8_ = 0;
  local_148.super__Function_base._M_functor._M_unused._M_object =
       ScalarFunction::
       UnaryFunction<double,double,duckdb::NoInfiniteDoubleWrapper<duckdb::CosOperator>>;
  local_148._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_148.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_e0,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_e0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffe94;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffe9c;
  ScalarFunction::ScalarFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_f8,&local_128,&local_148,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0);
  LogicalType::~LogicalType(&local_e0);
  if (local_148.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_148.super__Function_base._M_manager)
              ((_Any_data *)&local_148,(_Any_data *)&local_148,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_128);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_f8);
  LogicalType::~LogicalType(&local_110);
  BaseScalarFunction::SetReturnsError(&local_c8,&in_RDI->super_BaseScalarFunction);
  BaseScalarFunction::~BaseScalarFunction(&local_c8);
  return in_RDI;
}

Assistant:

ScalarFunction CosFun::GetFunction() {
	ScalarFunction function({LogicalType::DOUBLE}, LogicalType::DOUBLE,
	                        ScalarFunction::UnaryFunction<double, double, NoInfiniteDoubleWrapper<CosOperator>>);
	BaseScalarFunction::SetReturnsError(function);
	return function;
}